

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O2

Maybe<capnp::compiler::Module_&> __thiscall
capnp::compiler::ModuleLoader::Impl::loadModuleFromSearchPath(Impl *this,PathPtr path)

{
  ArrayDisposer *pAVar1;
  ArrayDisposer *pAVar2;
  String *dir;
  PathPtr path_00;
  GlobalErrorReporter *local_38;
  
  dir = path.parts.ptr;
  pAVar2 = (ArrayDisposer *)(dir->content).size_;
  pAVar1 = (dir->content).disposer;
  do {
    if (pAVar2 == pAVar1) {
      local_38 = (GlobalErrorReporter *)0x0;
      break;
    }
    path_00.parts.size_ = path.parts.size_;
    path_00.parts.ptr = (String *)pAVar2->_vptr_ArrayDisposer;
    loadModule((Impl *)&stack0xffffffffffffffc8,(ReadableDirectory *)dir,path_00);
    pAVar2 = pAVar2 + 1;
  } while (local_38 == (GlobalErrorReporter *)0x0);
  this->errorReporter = local_38;
  return (Maybe<capnp::compiler::Module_&>)(Module *)this;
}

Assistant:

kj::Maybe<Module&> ModuleLoader::Impl::loadModuleFromSearchPath(kj::PathPtr path) {
  for (auto candidate: searchPath) {
    KJ_IF_SOME(module, loadModule(*candidate, path)) {
      return module;
    }
  }
  return kj::none;
}